

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::btMultiBody
          (btMultiBody *this,int n_links,btScalar mass,btVector3 *inertia,bool fixedBase,
          bool canSleep,bool param_6)

{
  btMultibodyLink *pbVar1;
  btMatrix3x3 *pbVar2;
  undefined8 uVar3;
  uint uVar4;
  btMultibodyLink *pbVar5;
  long lVar6;
  btMatrix3x3 *pbVar7;
  int iVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  uint uStack_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar13 = 0;
  this->_vptr_btMultiBody = (_func_int **)&PTR__btMultiBody_00220dd0;
  this->m_baseCollider = (btMultiBodyLinkCollider *)0x0;
  this->m_baseName = (char *)0x0;
  (this->m_basePos).m_floats[0] = 0.0;
  (this->m_basePos).m_floats[1] = 0.0;
  (this->m_basePos).m_floats[2] = 0.0;
  (this->m_basePos).m_floats[3] = 0.0;
  *(undefined8 *)((this->m_basePos).m_floats + 3) = 0;
  (this->m_baseQuat).super_btQuadWord.m_floats[1] = 0.0;
  (this->m_baseQuat).super_btQuadWord.m_floats[2] = 0.0;
  (this->m_baseQuat).super_btQuadWord.m_floats[3] = 1.0;
  this->m_baseMass = mass;
  uVar3 = *(undefined8 *)(inertia->m_floats + 2);
  *(undefined8 *)(this->m_baseInertia).m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)((this->m_baseInertia).m_floats + 2) = uVar3;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (btMultibodyLink *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_colliders).m_ownsMemory = true;
  (this->m_colliders).m_data = (btMultiBodyLinkCollider **)0x0;
  (this->m_colliders).m_size = 0;
  (this->m_colliders).m_capacity = 0;
  (this->m_deltaV).m_ownsMemory = true;
  (this->m_deltaV).m_data = (float *)0x0;
  (this->m_deltaV).m_size = 0;
  (this->m_deltaV).m_capacity = 0;
  (this->m_realBuf).m_ownsMemory = true;
  (this->m_realBuf).m_data = (float *)0x0;
  (this->m_realBuf).m_size = 0;
  (this->m_realBuf).m_capacity = 0;
  (this->m_vectorBuf).m_ownsMemory = true;
  (this->m_vectorBuf).m_data = (btVector3 *)0x0;
  (this->m_vectorBuf).m_size = 0;
  (this->m_vectorBuf).m_capacity = 0;
  (this->m_matrixBuf).m_ownsMemory = true;
  (this->m_matrixBuf).m_data = (btMatrix3x3 *)0x0;
  (this->m_matrixBuf).m_size = 0;
  (this->m_matrixBuf).m_capacity = 0;
  this->m_fixedBase = fixedBase;
  this->m_awake = true;
  this->m_canSleep = canSleep;
  uVar4 = 0;
  this->m_sleepTimer = 0.0;
  this->m_linearDamping = 0.04;
  this->m_angularDamping = 0.04;
  this->m_useGyroTerm = true;
  this->m_maxAppliedImpulse = 1000.0;
  this->m_maxCoordinateVelocity = 100.0;
  this->m_hasSelfCollision = true;
  this->__posUpdated = false;
  *(undefined4 *)((long)&this->m_posVarCnt + 3) = 0;
  this->m_dofCount = 0;
  this->m_posVarCnt = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  if (0 < n_links) {
    uVar11 = (ulong)(uint)n_links;
    pbVar5 = (btMultibodyLink *)btAlignedAllocInternal(uVar11 * 600,0x10);
    lVar6 = (long)(this->m_links).m_size;
    if (0 < lVar6) {
      lVar12 = 0;
      do {
        puVar9 = (undefined8 *)((long)(&pbVar5->m_cachedWorldTransform + 1) + lVar12);
        pbVar1 = (this->m_links).m_data;
        memcpy(puVar9 + -0x49,(void *)((long)(pbVar1->m_inertiaLocal).m_floats + lVar12 + -4),0x208)
        ;
        puVar10 = (undefined8 *)
                  ((long)(pbVar1->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar12);
        uVar3 = puVar10[1];
        puVar9[-8] = *puVar10;
        puVar9[-7] = uVar3;
        puVar10 = (undefined8 *)
                  ((long)(pbVar1->m_cachedWorldTransform).m_basis.m_el[1].m_floats + lVar12);
        uVar3 = puVar10[1];
        puVar9[-6] = *puVar10;
        puVar9[-5] = uVar3;
        puVar10 = (undefined8 *)
                  ((long)(pbVar1->m_cachedWorldTransform).m_basis.m_el[2].m_floats + lVar12);
        uVar3 = puVar10[1];
        puVar9[-4] = *puVar10;
        puVar9[-3] = uVar3;
        puVar10 = (undefined8 *)((long)(pbVar1->m_cachedWorldTransform).m_origin.m_floats + lVar12);
        uVar3 = puVar10[1];
        puVar9[-2] = *puVar10;
        puVar9[-1] = uVar3;
        puVar10 = (undefined8 *)((long)(&pbVar1->m_cachedWorldTransform + 1) + lVar12);
        uVar3 = puVar10[1];
        *puVar9 = *puVar10;
        puVar9[1] = uVar3;
        lVar12 = lVar12 + 600;
      } while (lVar6 * 600 != lVar12);
    }
    pbVar1 = (this->m_links).m_data;
    if ((pbVar1 != (btMultibodyLink *)0x0) && ((this->m_links).m_ownsMemory == true)) {
      btAlignedFreeInternal(pbVar1);
    }
    (this->m_links).m_ownsMemory = true;
    (this->m_links).m_data = pbVar5;
    (this->m_links).m_capacity = n_links;
    lVar6 = 0x234;
    do {
      pbVar5 = (this->m_links).m_data;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x234) = 0x3f8000003f800000;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x22c) = 0x3f8000003f800000;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x224) = 0xffffffff00000000;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x21c) = 0;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x214) = 0x3f80000000000000;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x20c) = 0;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x204) = 0;
      *(undefined8 *)((long)pbVar5 + lVar6 + -0x1fc) = 0;
      *(undefined8 *)((long)pbVar5 + lVar6 + -500) = 0;
      puVar9 = &local_88;
      puVar10 = (undefined8 *)((long)pbVar5 + lVar6 + -0x1ec);
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar10 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
        puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
      }
      *(undefined4 *)((long)pbVar5 + lVar6 + -0x19c) = 0x3f800000;
      puVar9 = (undefined8 *)((long)(pbVar5->m_inertiaLocal).m_floats + lVar6 + -4);
      memset(puVar9 + -0x33,0,0xac);
      *(undefined8 *)((long)puVar9 + -0xe4) = 0;
      *(undefined8 *)((long)puVar9 + -0xdc) = 0x3f80000000000000;
      *(undefined8 *)((long)puVar9 + -0xd4) = 0;
      *(undefined8 *)((long)puVar9 + -0xcc) = 0;
      *(undefined8 *)((long)puVar9 + -0xc4) = 0;
      *(undefined8 *)((long)puVar9 + -0xbc) = 0;
      *(undefined8 *)((long)puVar9 + -0xb4) = 0;
      *(undefined8 *)((long)puVar9 + -0xac) = 0;
      *(undefined8 *)((long)puVar9 + -0x84) = 0;
      *(undefined8 *)((long)puVar9 + -0x7c) = 0x3f80000000000000;
      *(undefined8 *)((long)puVar9 + -0x74) = 0;
      *(undefined8 *)((long)puVar9 + -0x6c) = 0;
      *(undefined8 *)((long)puVar9 + -100) = 0;
      *(undefined8 *)((long)puVar9 + -0x5c) = 0;
      *(undefined4 *)((long)puVar9 + -0x54) = 0;
      puVar9[-10] = (ulong)uStack_a0;
      puVar9[-9] = 0;
      puVar9[-8] = 0;
      *(undefined4 *)(puVar9 + -7) = 5;
      *(undefined8 *)((long)puVar9 + -0x34) = 0;
      *(undefined4 *)((long)puVar9 + -0x2c) = 0x3f800000;
      puVar9[-5] = 0;
      puVar9[-4] = 0;
      *(undefined4 *)(puVar9 + -3) = 0x3f800000;
      *(undefined8 *)((long)puVar9 + -0x14) = 0;
      *(undefined8 *)((long)puVar9 + -0xc) = 0;
      *(undefined4 *)((long)puVar9 + -4) = 0x3f800000;
      *(undefined4 *)(puVar9 + 4) = 0;
      puVar9[2] = 0;
      puVar9[3] = 0;
      *puVar9 = 0;
      puVar9[1] = 0;
      lVar6 = lVar6 + 600;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    uVar4 = (this->m_matrixBuf).m_size;
  }
  (this->m_links).m_size = n_links;
  iVar8 = n_links + 1;
  if (((int)uVar4 <= n_links) && ((this->m_matrixBuf).m_capacity <= n_links)) {
    if (iVar8 == 0) {
      pbVar7 = (btMatrix3x3 *)0x0;
    }
    else {
      pbVar7 = (btMatrix3x3 *)btAlignedAllocInternal((long)iVar8 * 0x30,0x10);
      uVar4 = (this->m_matrixBuf).m_size;
    }
    if (0 < (int)uVar4) {
      lVar6 = 0;
      do {
        pbVar2 = (this->m_matrixBuf).m_data;
        puVar9 = (undefined8 *)((long)pbVar2->m_el[0].m_floats + lVar6);
        uVar3 = puVar9[1];
        puVar10 = (undefined8 *)((long)pbVar7->m_el[0].m_floats + lVar6);
        *puVar10 = *puVar9;
        puVar10[1] = uVar3;
        puVar9 = (undefined8 *)((long)pbVar2->m_el[1].m_floats + lVar6);
        uVar3 = puVar9[1];
        puVar10 = (undefined8 *)((long)pbVar7->m_el[1].m_floats + lVar6);
        *puVar10 = *puVar9;
        puVar10[1] = uVar3;
        puVar10 = (undefined8 *)((long)pbVar2->m_el[2].m_floats + lVar6);
        uVar3 = puVar10[1];
        puVar9 = (undefined8 *)((long)pbVar7->m_el[2].m_floats + lVar6);
        *puVar9 = *puVar10;
        puVar9[1] = uVar3;
        lVar6 = lVar6 + 0x30;
      } while ((ulong)uVar4 * 0x30 != lVar6);
    }
    pbVar2 = (this->m_matrixBuf).m_data;
    if ((pbVar2 != (btMatrix3x3 *)0x0) && ((this->m_matrixBuf).m_ownsMemory == true)) {
      btAlignedFreeInternal(pbVar2);
    }
    (this->m_matrixBuf).m_ownsMemory = true;
    (this->m_matrixBuf).m_data = pbVar7;
    (this->m_matrixBuf).m_capacity = iVar8;
  }
  (this->m_matrixBuf).m_size = iVar8;
  (this->m_baseForce).m_floats[0] = 0.0;
  (this->m_baseForce).m_floats[1] = 0.0;
  (this->m_baseForce).m_floats[2] = 0.0;
  (this->m_baseForce).m_floats[3] = 0.0;
  (this->m_baseTorque).m_floats[0] = 0.0;
  (this->m_baseTorque).m_floats[1] = 0.0;
  (this->m_baseTorque).m_floats[2] = 0.0;
  (this->m_baseTorque).m_floats[3] = 0.0;
  return;
}

Assistant:

btMultiBody::btMultiBody(int n_links,
                     btScalar mass,
                     const btVector3 &inertia,
                     bool fixedBase,
                     bool canSleep,
		     bool /*deprecatedUseMultiDof*/)
    : 
    	m_baseCollider(0),
		m_baseName(0),
    	m_basePos(0,0,0),
    	m_baseQuat(0, 0, 0, 1),
      m_baseMass(mass),
      m_baseInertia(inertia),
    
		m_fixedBase(fixedBase),
		m_awake(true),
		m_canSleep(canSleep),
		m_sleepTimer(0),
		
		m_linearDamping(0.04f),
		m_angularDamping(0.04f),
		m_useGyroTerm(true),
			m_maxAppliedImpulse(1000.f),
		m_maxCoordinateVelocity(100.f),
			m_hasSelfCollision(true),		
		__posUpdated(false),
			m_dofCount(0),
		m_posVarCnt(0),
		m_useRK4(false), 	
		m_useGlobalVelocities(false),
		m_internalNeedsJointFeedback(false)
{
	m_links.resize(n_links);
	m_matrixBuf.resize(n_links + 1);


    m_baseForce.setValue(0, 0, 0);
    m_baseTorque.setValue(0, 0, 0);
}